

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

polylabel *
Search::allowed_actions_to_ld
          (search_private *priv,size_t ec_cnt,action *allowed_actions,size_t allowed_actions_cnt,
          float *allowed_actions_cost)

{
  byte isCB_00;
  float value;
  size_t sVar1;
  ulong in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  action k_4;
  action k_3;
  action k_2;
  action k_1;
  action k;
  uint32_t num_costs;
  polylabel *ld;
  bool isCB;
  polylabel *in_stack_ffffffffffffffa8;
  ulong uVar2;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  bool isCB_01;
  uint uVar3;
  uint in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float index;
  polylabel *ld_00;
  
  isCB_00 = *(byte *)(in_RDI + 0x68) & 1;
  ld_00 = *(polylabel **)(in_RDI + 0x200);
  sVar1 = cs_get_costs_size(SUB41((uint)in_stack_ffffffffffffffb4 >> 0x18,0),
                            in_stack_ffffffffffffffa8);
  value = (float)sVar1;
  isCB_01 = SUB41((uint)in_stack_ffffffffffffffb4 >> 0x18,0);
  if ((*(byte *)(in_RDI + 0x13) & 1) == 0) {
    if ((*(byte *)(in_RDI + 0x14) & 1) == 0) {
      if ((in_RDX == 0) || (in_RCX == 0)) {
        if ((sVar1 & 0xffffffff) != *(ulong *)(in_RDI + 0x58)) {
          cs_costs_erase(isCB_01,in_stack_ffffffffffffffa8);
          for (uVar3 = 0; (ulong)uVar3 < *(ulong *)(in_RDI + 0x58); uVar3 = uVar3 + 1) {
            cs_cost_push_back((bool)isCB_00,ld_00,(uint32_t)value,in_stack_ffffffffffffffc0);
          }
        }
      }
      else {
        cs_costs_erase(isCB_01,in_stack_ffffffffffffffa8);
        for (uVar2 = 0; uVar2 < in_RCX; uVar2 = uVar2 + 1) {
          cs_cost_push_back((bool)isCB_00,ld_00,(uint32_t)value,in_stack_ffffffffffffffc0);
        }
      }
    }
    else if (in_RDX == 0) {
      sVar1 = cs_get_costs_size(isCB_01,in_stack_ffffffffffffffa8);
      if (sVar1 != *(size_t *)(in_RDI + 0x58)) {
        cs_costs_erase(SUB41((uint)in_stack_ffffffffffffffb4 >> 0x18,0),in_stack_ffffffffffffffa8);
        for (in_stack_ffffffffffffffbc = 0;
            (ulong)in_stack_ffffffffffffffbc < *(ulong *)(in_RDI + 0x58);
            in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
          cs_cost_push_back((bool)isCB_00,ld_00,(uint32_t)value,in_stack_ffffffffffffffc0);
        }
      }
      for (uVar3 = 0; (ulong)uVar3 < *(ulong *)(in_RDI + 0x58); uVar3 = uVar3 + 1) {
        cs_set_cost_loss(SUB41((uint)value >> 0x18,0),
                         (polylabel *)CONCAT44(in_stack_ffffffffffffffbc,uVar3),
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (float)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      }
    }
    else {
      cs_costs_erase(isCB_01,in_stack_ffffffffffffffa8);
      for (uVar3 = 0; uVar3 < in_RCX; uVar3 = uVar3 + 1) {
        cs_cost_push_back((bool)isCB_00,ld_00,(uint32_t)value,in_stack_ffffffffffffffc0);
      }
    }
  }
  else if (in_RSI < (sVar1 & 0xffffffff)) {
    cs_costs_resize(isCB_01,in_stack_ffffffffffffffa8,0x39d251);
  }
  else {
    index = value;
    if ((sVar1 & 0xffffffff) < in_RSI) {
      for (; (uint)value < in_RSI; value = (float)((int)value + 1)) {
        cs_cost_push_back((bool)isCB_00,ld_00,(uint32_t)index,value);
      }
    }
  }
  return ld_00;
}

Assistant:

polylabel& allowed_actions_to_ld(search_private& priv, size_t ec_cnt, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost)
{
  bool isCB = priv.cb_learner;
  polylabel& ld = *priv.allowed_actions_cache;
  uint32_t num_costs = (uint32_t)cs_get_costs_size(isCB, ld);

  if (priv.is_ldf)  // LDF version easier
  {
    if (num_costs > ec_cnt)
      cs_costs_resize(isCB, ld, ec_cnt);
    else if (num_costs < ec_cnt)
      for (action k = num_costs; k < ec_cnt; k++) cs_cost_push_back(isCB, ld, k, FLT_MAX);
  }
  else if (priv.use_action_costs)
  {
    // TODO: Weight
    if (allowed_actions == nullptr)
    {
      if (cs_get_costs_size(isCB, ld) != priv.A)
      {
        cs_costs_erase(isCB, ld);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, ld, k + 1, 0.);
      }
      for (action k = 0; k < priv.A; k++) cs_set_cost_loss(isCB, ld, k, allowed_actions_cost[k]);
    }
    else  // manually specified actions
    {
      cs_costs_erase(isCB, ld);
      for (action k = 0; k < allowed_actions_cnt; k++)
        cs_cost_push_back(isCB, ld, allowed_actions[k], allowed_actions_cost[k]);
    }
  }
  else  // non-LDF version, no action costs
  {
    if ((allowed_actions == nullptr) || (allowed_actions_cnt == 0))  // any action is allowed
    {
      if (num_costs != priv.A)  // if there are already A-many actions, they must be the right ones, unless the user did
                                // something stupid like putting duplicate allowed_actions...
      {
        cs_costs_erase(isCB, ld);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, ld, k + 1, FLT_MAX);  //+1 because MC is 1-based
      }
    }
    else  // we need to peek at allowed_actions
    {
      cs_costs_erase(isCB, ld);
      for (size_t i = 0; i < allowed_actions_cnt; i++) cs_cost_push_back(isCB, ld, allowed_actions[i], FLT_MAX);
    }
  }

  return ld;
}